

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::RestoreRegexStacks(ScriptContext *this,RegexStacks *stacks)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegexStacks *obj;
  
  if (stacks == (RegexStacks *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x4cf,"(stacks)","stacks");
    if (!bVar2) goto LAB_006ead45;
    *puVar3 = 0;
  }
  obj = this->regexStacks;
  if (obj == stacks) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x4d0,"(stacks != regexStacks)","stacks != regexStacks");
    if (!bVar2) {
LAB_006ead45:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    obj = this->regexStacks;
  }
  if (obj != (RegexStacks *)0x0) {
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,UnifiedRegex::RegexStacks>
              (&this->regexAllocator,obj);
  }
  this->regexStacks = stacks;
  return;
}

Assistant:

void ScriptContext::RestoreRegexStacks(UnifiedRegex::RegexStacks *const stacks)
    {
        Assert(stacks);
        Assert(stacks != regexStacks);

        if (regexStacks)
        {
            Adelete(RegexAllocator(), regexStacks);
        }
        regexStacks = stacks;
    }